

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

bool __thiscall
wasm::analysis::Vector<wasm::analysis::Bool>::join
          (Vector<wasm::analysis::Bool> *this,Element *joinee,SingletonElement *joiner)

{
  ulong uVar1;
  _Bit_type *p_Var2;
  bool bVar3;
  unsigned_long *index;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = (joiner->super_pair<unsigned_long,_bool>).first;
  p_Var2 = (joinee->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  if (uVar1 < (ulong)(joinee->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
              ((long)(joinee->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var2
              ) * 8) {
    uVar5 = uVar1 + 0x3f;
    if (-1 < (long)uVar1) {
      uVar5 = uVar1;
    }
    uVar4 = (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001);
    bVar3 = (bool)((p_Var2[((long)uVar5 >> 6) + uVar4 + 0xffffffffffffffff] >> (uVar1 & 0x3f) & 1)
                   == 0 & (joiner->super_pair<unsigned_long,_bool>).second);
    if (bVar3 == true) {
      p_Var2[((long)uVar5 >> 6) + uVar4 + 0xffffffffffffffff] =
           p_Var2[((long)uVar5 >> 6) + uVar4 + 0xffffffffffffffff] | 1L << ((byte)uVar1 & 0x3f);
    }
    return bVar3;
  }
  __assert_fail("index < joinee.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/vector.h"
                ,0x5f,
                "bool wasm::analysis::Vector<wasm::analysis::Bool>::join(Element &, const SingletonElement &) const [L = wasm::analysis::Bool]"
               );
}

Assistant:

bool join(Element& joinee, const SingletonElement& joiner) const noexcept {
    const auto& [index, elem] = joiner;
    assert(index < joinee.size());
    return joinAtIndex(joinee, index, elem);
  }